

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::StencilTexturing::FunctionalTest::verifyTexture
          (FunctionalTest *this,GLuint id,GLenum source_internal_format,bool is_stencil,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src_texture_data)

{
  ostringstream *poVar1;
  float fVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  size_type __new_size;
  float *pfVar5;
  long lVar6;
  uint uVar7;
  undefined4 uVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst_texture_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar9 = (int)CONCAT71(in_register_00000009,is_stencil) != 0;
  uVar8 = 0x1903;
  if (bVar9) {
    uVar8 = 0x8d94;
  }
  __new_size = 0x100;
  if (bVar9) {
    __new_size = 0x40;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1c8,__new_size);
  (**(code **)(lVar6 + 0xb8))(0xde1,id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x468);
  (**(code **)(lVar6 + 0xaa0))
            (0xde1,0,uVar8,(ulong)!is_stencil * 5 + 0x1401,
             local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x46b);
  (**(code **)(lVar6 + 0xb8))(0xde1,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x46e);
  uVar7 = 0;
  bVar9 = false;
  do {
    lVar6 = (ulong)uVar7 << !is_stencil * '\x02';
    pfVar5 = (float *)((src_texture_data->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start +
                      (uVar7 << (source_internal_format == 0x88f0 ^ 3U)));
    if (is_stencil) {
      if (*(uchar *)(pfVar5 + (source_internal_format != 0x88f0)) !=
          local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6]) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Invalid pixel [",0xf);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], got: ",8);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_009f2f64;
      }
    }
    else {
      fVar2 = *(float *)(local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (source_internal_format == 0x88f0) {
        fVar12 = (float)*(uint3 *)((long)pfVar5 + 1) / 16777215.0;
        fVar10 = fVar12 - fVar2;
        fVar11 = -fVar10;
        if (-fVar10 <= fVar10) {
          fVar11 = fVar10;
        }
        if (0.0001 < fVar11) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Invalid pixel [",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], got: ",8);
          std::ostream::_M_insert<double>((double)fVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
          std::ostream::_M_insert<double>((double)fVar12);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_009f2f64:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
          goto LAB_009f2f76;
        }
      }
      else {
        fVar11 = *pfVar5;
        fVar12 = fVar11 - fVar2;
        fVar10 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar10 = fVar12;
        }
        if (0.0001 < fVar10) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Invalid pixel [",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], got: ",8);
          std::ostream::_M_insert<double>((double)fVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
          std::ostream::_M_insert<double>((double)fVar11);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_009f2f64;
        }
      }
    }
    bVar9 = 0x3e < uVar7;
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x40) {
      bVar9 = true;
LAB_009f2f76:
      if (local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return bVar9;
    }
  } while( true );
}

Assistant:

bool FunctionalTest::verifyTexture(GLuint id, GLenum source_internal_format, bool is_stencil,
								   const std::vector<GLubyte>& src_texture_data)
{
	static const GLuint  n_pixels		= m_width * m_height;
	const Functions&	 gl				= m_context.getRenderContext().getFunctions();
	GLuint				 dst_pixel_size = 0;
	std::vector<GLubyte> dst_texture_data;
	GLuint				 dst_texture_size = 0;
	GLenum				 format			  = 0;
	GLuint				 src_pixel_size   = 0;
	GLuint				 src_stencil_off  = 0;
	GLenum				 type			  = 0;

	/* Select size of pixel */
	if (true == is_stencil)
	{
		format		   = GL_RED_INTEGER;
		dst_pixel_size = 1;
		type		   = GL_UNSIGNED_BYTE;
	}
	else
	{
		format		   = GL_RED;
		dst_pixel_size = 4;
		type		   = GL_FLOAT;
	}

	if (GL_DEPTH24_STENCIL8 == source_internal_format)
	{
		src_pixel_size = 4;
	}
	else
	{
		src_pixel_size  = 8;
		src_stencil_off = 4;
	}

	/* Allocate storage */
	dst_texture_size = dst_pixel_size * n_pixels;
	dst_texture_data.resize(dst_texture_size);

	/* Get texture contents */
	gl.bindTexture(GL_TEXTURE_2D, id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.getTexImage(GL_TEXTURE_2D, 0 /* level */, format, type, &dst_texture_data[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* For each pixel */
	for (GLuint i = 0; i < n_pixels; ++i)
	{
		const GLuint dst_pixel_offset = dst_pixel_size * i;
		const GLuint src_pixel_offset = src_pixel_size * i;

		const GLubyte* dst_pixel_data = &dst_texture_data[0] + dst_pixel_offset;
		const GLubyte* src_pixel_data = &src_texture_data[0] + src_pixel_offset;

		if (true == is_stencil) /* Stencil channel */
		{
			const GLubyte dst_stencil = dst_pixel_data[0];
			const GLubyte src_stencil = src_pixel_data[src_stencil_off];

			if (src_stencil != dst_stencil)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid pixel [" << i
													<< "], got: " << (GLuint)dst_stencil
													<< " expected: " << (GLuint)src_stencil << tcu::TestLog::EndMessage;

				return false;
			}
		}
		else /* Depth channel */
		{
			if (GL_DEPTH24_STENCIL8 == source_internal_format) /* DEPTH24 */
			{
				GLfloat dst_depth   = 0.0f;
				GLuint  src_depth_i = 0;
				GLfloat src_depth_f = 0.0f;

				memcpy(&dst_depth, dst_pixel_data, 4);
				memcpy(&src_depth_i, src_pixel_data + 1, 3);

				src_depth_f = ((GLfloat)src_depth_i) / ((GLfloat)0xffffff);

				if (de::abs(src_depth_f - dst_depth) > 0.0001f)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid pixel [" << i
														<< "], got: " << dst_depth << " expected: " << src_depth_f
														<< tcu::TestLog::EndMessage;

					return false;
				}
			}
			else /* DEPTH32F */
			{
				GLfloat dst_depth = 0.0f;
				GLfloat src_depth = 0.0f;

				memcpy(&dst_depth, dst_pixel_data, 4);
				memcpy(&src_depth, src_pixel_data, 4);

				if (de::abs(src_depth - dst_depth) > 0.0001f)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid pixel [" << i
														<< "], got: " << dst_depth << " expected: " << src_depth
														<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}